

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out.c
# Opt level: O0

int ly_out_fd(ly_out *out,int fd)

{
  int __fd;
  int *piVar1;
  char *pcVar2;
  FILE *pFVar3;
  FILE *stream;
  int local_20;
  int streamfd;
  int prev_fd;
  int fd_local;
  ly_out *out_local;
  
  if (out == (ly_out *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","out","ly_out_fd");
    out_local._4_4_ = -1;
  }
  else if (out->type < LY_OUT_FILE) {
    if (out->type == LY_OUT_FDSTREAM) {
      local_20 = (out->method).fdstream.fd;
    }
    else {
      local_20 = (out->method).fd;
    }
    if (fd != -1) {
      if (out->type == LY_OUT_FDSTREAM) {
        __fd = dup(fd);
        if (__fd < 0) {
          piVar1 = __errno_location();
          pcVar2 = strerror(*piVar1);
          ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,
                 "Unable to duplicate provided file descriptor (%d) for printing the output (%s).",
                 (ulong)(uint)fd,pcVar2);
          return -1;
        }
        pFVar3 = fdopen(__fd,"a");
        if (pFVar3 == (FILE *)0x0) {
          piVar1 = __errno_location();
          pcVar2 = strerror(*piVar1);
          ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,
                 "Unable to open provided file descriptor (%d) for printing the output (%s).",
                 (ulong)(uint)fd,pcVar2);
          close(__fd);
          return -1;
        }
        fclose((FILE *)(out->method).f);
        (out->method).f = (FILE *)pFVar3;
        (out->method).fdstream.fd = __fd;
      }
      else {
        (out->method).fd = fd;
      }
    }
    out_local._4_4_ = local_20;
  }
  else {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",
           "out->type <= LY_OUT_FDSTREAM","ly_out_fd");
    out_local._4_4_ = -1;
  }
  return out_local._4_4_;
}

Assistant:

LIBYANG_API_DEF int
ly_out_fd(struct ly_out *out, int fd)
{
    int prev_fd;

    LY_CHECK_ARG_RET(NULL, out, out->type <= LY_OUT_FDSTREAM, -1);

    if (out->type == LY_OUT_FDSTREAM) {
        prev_fd = out->method.fdstream.fd;
    } else { /* LY_OUT_FD */
        prev_fd = out->method.fd;
    }

    if (fd != -1) {
        /* replace output stream */
        if (out->type == LY_OUT_FDSTREAM) {
            int streamfd;
            FILE *stream;

            streamfd = dup(fd);
            if (streamfd < 0) {
                LOGERR(NULL, LY_ESYS, "Unable to duplicate provided file descriptor (%d) for printing the output (%s).", fd, strerror(errno));
                return -1;
            }
            stream = fdopen(streamfd, "a");
            if (!stream) {
                LOGERR(NULL, LY_ESYS, "Unable to open provided file descriptor (%d) for printing the output (%s).", fd, strerror(errno));
                close(streamfd);
                return -1;
            }
            /* close only the internally created stream, file descriptor is returned and supposed to be closed by the caller */
            fclose(out->method.fdstream.f);
            out->method.fdstream.f = stream;
            out->method.fdstream.fd = streamfd;
        } else { /* LY_OUT_FD */
            out->method.fd = fd;
        }
    }

    return prev_fd;
}